

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBody.cpp
# Opt level: O1

void __thiscall
chrono::ChBody::ComputeNF
          (ChBody *this,double U,double V,double W,ChVectorDynamic<> *Qi,double *detJ,
          ChVectorDynamic<> *F,ChVectorDynamic<> *state_x,ChVectorDynamic<> *state_w)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  uint uVar6;
  char *__function;
  uint uVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  ChCoordsys<double> bodycoord;
  ChVector<double> body_locT;
  ChVector<double> body_absF;
  ChVector<double> absT;
  ChVector<double> absF;
  ChCoordsys<double> local_128;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  double local_c8;
  double dStack_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  ChVector<double> local_98;
  ChVector<double> local_80;
  double *local_68;
  undefined8 local_60;
  ChVectorDynamic<> *local_50;
  undefined8 local_48;
  long local_38;
  
  local_128.pos.m_data[0] =
       (double)(F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  local_128.rot.m_data[3] =
       (double)(F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  local_128.pos.m_data[1] = 1.48219693752374e-323;
  local_128.rot.m_data[1] = 0.0;
  local_b0 = U;
  local_a8 = V;
  local_a0 = W;
  if (2 < (long)local_128.rot.m_data[3]) {
    local_128.rot.m_data[0] = (double)F;
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
              (&local_80,
               (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                *)&local_128,(type *)0x0);
    local_128.rot.m_data[3] =
         (double)(F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_rows;
    local_128.pos.m_data[0] =
         (double)((F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                  m_data + 3);
    local_128.pos.m_data[1] = 1.48219693752374e-323;
    local_128.rot.m_data[1] = 1.48219693752374e-323;
    if (5 < (long)local_128.rot.m_data[3]) {
      local_128.rot.m_data[0] = (double)F;
      ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
                (&local_98,
                 (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                  *)&local_128,(type *)0x0);
      local_b8 = 0.0;
      local_c8 = 0.0;
      dStack_c0 = 0.0;
      local_d8 = 0;
      local_e8 = 0;
      uStack_e0 = 0;
      local_128.pos.m_data[2] = 0.0;
      local_128.pos.m_data[0] = 0.0;
      local_128.pos.m_data[1] = 0.0;
      local_128.rot.m_data[0] = 1.0;
      local_128.rot.m_data[1] = 0.0;
      local_128.rot.m_data[2] = 0.0;
      local_128.rot.m_data[3] = 0.0;
      if (state_x == (ChVectorDynamic<> *)0x0) {
        if (&(this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord !=
            &local_128) {
          local_128.pos.m_data[0] =
               (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.pos
               .m_data[0];
          local_128.pos.m_data[1] =
               (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.pos
               .m_data[1];
          local_128.pos.m_data[2] =
               (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.pos
               .m_data[2];
          local_128.rot.m_data[0] =
               (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.rot
               .m_data[0];
          local_128.rot.m_data[1] =
               (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.rot
               .m_data[1];
          local_128.rot.m_data[2] =
               (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.rot
               .m_data[2];
          local_128.rot.m_data[3] =
               (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.rot
               .m_data[3];
        }
LAB_00510026:
        auVar10._8_8_ = 0;
        auVar10._0_8_ = local_80.m_data[0];
        auVar14._8_8_ = 0;
        auVar14._0_8_ = local_80.m_data[1];
        local_c8 = local_80.m_data[0];
        dStack_c0 = local_80.m_data[1];
        auVar18._8_8_ = 0;
        auVar18._0_8_ = local_80.m_data[2];
        local_b8 = local_80.m_data[2];
        auVar26._8_8_ = 0;
        auVar26._0_8_ = local_a8 - local_128.pos.m_data[1];
        auVar29._8_8_ = 0;
        auVar29._0_8_ = local_80.m_data[1] * (local_a0 - local_128.pos.m_data[2]);
        auVar9 = vfmsub231sd_fma(auVar29,auVar26,auVar18);
        auVar19._8_8_ = 0;
        auVar19._0_8_ = local_80.m_data[2] * (local_b0 - local_128.pos.m_data[0]);
        auVar28._8_8_ = 0;
        auVar28._0_8_ = local_a0 - local_128.pos.m_data[2];
        auVar10 = vfmsub231sd_fma(auVar19,auVar10,auVar28);
        auVar11._8_8_ = 0;
        auVar11._0_8_ = local_80.m_data[0] * (local_a8 - local_128.pos.m_data[1]);
        auVar22._8_8_ = 0;
        auVar22._0_8_ = local_b0 - local_128.pos.m_data[0];
        auVar11 = vfmsub231sd_fma(auVar11,auVar22,auVar14);
        local_98.m_data[0] = auVar9._0_8_ + local_98.m_data[0];
        local_98.m_data[1] = auVar10._0_8_ + local_98.m_data[1];
        local_98.m_data[2] = auVar11._0_8_ + local_98.m_data[2];
        auVar23._8_8_ = 0;
        auVar23._0_8_ = local_128.rot.m_data[0];
        dVar3 = local_128.rot.m_data[0] * local_128.rot.m_data[0];
        auVar9._8_8_ = 0x8000000000000000;
        auVar9._0_8_ = 0x8000000000000000;
        auVar9 = vxorpd_avx512vl(auVar23,auVar9);
        dVar21 = auVar9._0_8_;
        auVar11 = ZEXT816(0xbff0000000000000);
        auVar13 = ZEXT816(0x4000000000000000);
        auVar30._8_8_ = 0;
        auVar30._0_8_ = dVar3 + local_128.rot.m_data[1] * local_128.rot.m_data[1];
        auVar9 = vfmadd213sd_fma(auVar30,auVar13,auVar11);
        dVar4 = local_128.rot.m_data[1] * local_128.rot.m_data[2] - local_128.rot.m_data[3] * dVar21
        ;
        auVar15._8_8_ = 0;
        auVar15._0_8_ = local_98.m_data[0];
        auVar34._8_8_ = 0;
        auVar34._0_8_ = (dVar4 + dVar4) * local_98.m_data[1];
        auVar9 = vfmadd231sd_fma(auVar34,auVar15,auVar9);
        dVar4 = local_128.rot.m_data[2] * dVar21 + local_128.rot.m_data[3] * local_128.rot.m_data[1]
        ;
        auVar12._8_8_ = 0;
        auVar12._0_8_ = local_98.m_data[2];
        auVar31._8_8_ = 0;
        auVar31._0_8_ = dVar4 + dVar4;
        auVar9 = vfmadd213sd_fma(auVar31,auVar12,auVar9);
        dVar4 = local_128.rot.m_data[1] * local_128.rot.m_data[2] + local_128.rot.m_data[3] * dVar21
        ;
        auVar32._8_8_ = 0;
        auVar32._0_8_ = local_128.rot.m_data[2] * local_128.rot.m_data[2] + dVar3;
        auVar10 = vfmadd213sd_fma(auVar32,auVar13,auVar11);
        auVar24._8_8_ = 0;
        auVar24._0_8_ = dVar4 + dVar4;
        auVar33._8_8_ = 0;
        auVar33._0_8_ = auVar10._0_8_ * local_98.m_data[1];
        auVar10 = vfmadd231sd_fma(auVar33,auVar15,auVar24);
        dVar4 = local_128.rot.m_data[3] * local_128.rot.m_data[2] - local_128.rot.m_data[1] * dVar21
        ;
        auVar25._8_8_ = 0;
        auVar25._0_8_ = dVar4 + dVar4;
        auVar10 = vfmadd213sd_fma(auVar25,auVar12,auVar10);
        dVar5 = local_128.rot.m_data[3] * local_128.rot.m_data[1] - local_128.rot.m_data[2] * dVar21
        ;
        dVar4 = local_128.rot.m_data[1] * dVar21 + local_128.rot.m_data[3] * local_128.rot.m_data[2]
        ;
        auVar16._8_8_ = 0;
        auVar16._0_8_ = local_98.m_data[0];
        auVar20._8_8_ = 0;
        auVar20._0_8_ = local_98.m_data[1] * (dVar4 + dVar4);
        auVar27._8_8_ = 0;
        auVar27._0_8_ = dVar5 + dVar5;
        auVar12 = vfmadd231sd_fma(auVar20,auVar16,auVar27);
        auVar17._8_8_ = 0;
        auVar17._0_8_ = local_128.rot.m_data[3] * local_128.rot.m_data[3] + dVar3;
        auVar11 = vfmadd213sd_fma(auVar17,auVar13,auVar11);
        auVar13._8_8_ = 0;
        auVar13._0_8_ = local_98.m_data[2];
        auVar11 = vfmadd213sd_fma(auVar11,auVar13,auVar12);
        local_e8 = auVar9._0_8_;
        uStack_e0 = auVar10._0_8_;
        local_d8 = auVar11._0_8_;
        if (2 < (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_rows) {
          pdVar1 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                   m_data;
          uVar7 = 3;
          if ((((ulong)pdVar1 & 7) == 0) &&
             (uVar6 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7, uVar6 < 3)) {
            uVar7 = uVar6;
          }
          if (uVar7 != 0) {
            memcpy(pdVar1,&local_c8,(ulong)(uVar7 * 8));
          }
          if (uVar7 < 3) {
            uVar8 = (ulong)(uVar7 << 3);
            memcpy((void *)((long)pdVar1 + uVar8),(void *)((long)&local_c8 + uVar8),0x18 - uVar8);
          }
          if (5 < (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                  m_rows) {
            pdVar2 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                     m_data;
            pdVar1 = pdVar2 + 3;
            uVar7 = 3;
            if ((((ulong)pdVar1 & 7) == 0) &&
               (uVar6 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7, uVar6 < 3)) {
              uVar7 = uVar6;
            }
            if (uVar7 != 0) {
              memcpy(pdVar1,&local_e8,(ulong)(uVar7 * 8));
            }
            if (uVar7 < 3) {
              uVar8 = (ulong)(uVar7 << 3);
              memcpy((void *)((long)pdVar2 + uVar8 + 0x18),(void *)((long)&local_e8 + uVar8),
                     0x18 - uVar8);
            }
            *detJ = 1.0;
            return;
          }
        }
      }
      else {
        local_68 = (state_x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                   m_storage.m_data;
        local_38 = (state_x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                   m_storage.m_rows;
        local_60 = 7;
        local_48 = 0;
        local_50 = state_x;
        if (6 < local_38) {
          ChCoordsys<double>::operator=
                    (&local_128,
                     (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                      *)&local_68);
          goto LAB_00510026;
        }
      }
      __function = 
      "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
      ;
      goto LAB_005102af;
    }
  }
  local_128.pos.m_data[1] = 1.48219693752374e-323;
  __function = 
  "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
  ;
  local_128.rot.m_data[0] = (double)F;
LAB_005102af:
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,__function);
}

Assistant:

void ChBody::ComputeNF(
    const double U,              // x coordinate of application point in absolute space
    const double V,              // y coordinate of application point in absolute space
    const double W,              // z coordinate of application point in absolute space
    ChVectorDynamic<>& Qi,       // Return result of N'*F  here, maybe with offset block_offset
    double& detJ,                // Return det[J] here
    const ChVectorDynamic<>& F,  // Input F vector, size is 6, it is {Force,Torque} in absolute coords.
    ChVectorDynamic<>* state_x,  // if != 0, update state (pos. part) to this, then evaluate Q
    ChVectorDynamic<>* state_w   // if != 0, update state (speed part) to this, then evaluate Q
) {
    ChVector<> abs_pos(U, V, W);
    ChVector<> absF(F.segment(0, 3));
    ChVector<> absT(F.segment(3, 3));
    ChVector<> body_absF;
    ChVector<> body_locT;
    ChCoordsys<> bodycoord;
    if (state_x)
        bodycoord = state_x->segment(0, 7);  // the numerical jacobian algo might change state_x
    else
        bodycoord = this->coord;

    // compute Q components F,T, given current state of body 'bodycoord'. Note T in Q is in local csys, F is an abs csys
    body_absF = absF;
    body_locT = bodycoord.rot.RotateBack(absT + ((abs_pos - bodycoord.pos) % absF));
    Qi.segment(0, 3) = body_absF.eigen();
    Qi.segment(3, 3) = body_locT.eigen();
    detJ = 1;  // not needed because not used in quadrature.
}